

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

void absl::lts_20250127::cord_internal::CordRepExternal::Delete(CordRep *rep)

{
  if ((rep != (CordRep *)0x0) && (rep->tag == '\x05')) {
    if (*(code **)&rep[1].refcount != (code *)0x0) {
      (**(code **)&rep[1].refcount)();
      return;
    }
    __assert_fail("rep_external->releaser_invoker != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1b7,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
  }
  __assert_fail("rep != nullptr && rep->IsExternal()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x1b5,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
}

Assistant:

inline void CordRepExternal::Delete(CordRep* rep) {
  assert(rep != nullptr && rep->IsExternal());
  auto* rep_external = static_cast<CordRepExternal*>(rep);
  assert(rep_external->releaser_invoker != nullptr);
  rep_external->releaser_invoker(rep_external);
}